

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash_motion.c
# Opt level: O3

_Bool av1_add_to_hash_map_by_row_with_precal_data
                (hash_table *p_hash_table,uint32_t **pic_hash,int8_t *pic_is_same,int pic_width,
                int pic_height,int block_size)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  Vector *pVVar4;
  long lVar5;
  hash_table *phVar6;
  ulong uVar7;
  bool bVar8;
  block_hash curr_block_hash;
  undefined2 local_88;
  undefined2 local_86;
  uint32_t local_84;
  uint32_t **local_80;
  ulong local_78;
  hash_table *local_70;
  int local_68;
  int local_64;
  uint32_t *local_60;
  uint32_t *local_58;
  ulong local_50;
  ulong local_48;
  ulong local_40;
  long local_38;
  
  local_58 = *pic_hash;
  local_60 = pic_hash[1];
  local_70 = p_hash_table;
  iVar1 = hash_block_size_to_index(block_size);
  uVar2 = pic_width - block_size;
  if ((int)uVar2 < 0) {
    local_80 = (uint32_t **)0x1;
  }
  else {
    local_38 = (long)pic_width;
    local_40 = (ulong)((pic_height - block_size) + 1);
    local_50 = (ulong)uVar2;
    local_48 = (ulong)(uVar2 + 1);
    local_78 = 0;
    local_80 = (uint32_t **)0x0;
    phVar6 = local_70;
    local_68 = pic_height;
    local_64 = block_size;
    do {
      if (local_64 <= local_68) {
        lVar5 = 0;
        uVar7 = 0;
        do {
          if (pic_is_same[lVar5] != '\0') {
            local_88 = (undefined2)local_78;
            local_86 = (undefined2)uVar7;
            uVar2 = (uint)(ushort)local_58[lVar5] | iVar1 << 0x10;
            local_84 = local_60[lVar5];
            pVVar4 = phVar6->p_lookup_table[uVar2];
            if (pVVar4 == (Vector *)0x0) {
              pVVar4 = (Vector *)aom_malloc(0x20);
              phVar6->p_lookup_table[uVar2] = pVVar4;
              if ((phVar6->p_lookup_table[uVar2] == (Vector *)0x0) ||
                 (iVar3 = aom_vector_setup(phVar6->p_lookup_table[uVar2],10,8), iVar3 == -1))
              goto LAB_001cf630;
              pVVar4 = local_70->p_lookup_table[uVar2];
            }
            pic_hash = (uint32_t **)&local_88;
            iVar3 = aom_vector_push_back(pVVar4,&local_88);
            phVar6 = local_70;
            if (iVar3 == -1) goto LAB_001cf630;
          }
          uVar7 = uVar7 + 1;
          lVar5 = lVar5 + local_38;
        } while (local_40 != uVar7);
      }
      bVar8 = local_50 <= local_78;
      local_78 = local_78 + 1;
      pic_hash = (uint32_t **)CONCAT71((int7)((ulong)pic_hash >> 8),bVar8);
      pic_is_same = pic_is_same + 1;
      local_58 = local_58 + 1;
      local_60 = local_60 + 1;
      local_80 = pic_hash;
    } while (local_78 != local_48);
  }
LAB_001cf630:
  return (_Bool)((byte)local_80 & 1);
}

Assistant:

bool av1_add_to_hash_map_by_row_with_precal_data(hash_table *p_hash_table,
                                                 uint32_t *pic_hash[2],
                                                 int8_t *pic_is_same,
                                                 int pic_width, int pic_height,
                                                 int block_size) {
  const int x_end = pic_width - block_size + 1;
  const int y_end = pic_height - block_size + 1;

  const int8_t *src_is_added = pic_is_same;
  const uint32_t *src_hash[2] = { pic_hash[0], pic_hash[1] };

  int add_value = hash_block_size_to_index(block_size);
  assert(add_value >= 0);
  add_value <<= kSrcBits;
  const int crc_mask = (1 << kSrcBits) - 1;

  for (int x_pos = 0; x_pos < x_end; x_pos++) {
    for (int y_pos = 0; y_pos < y_end; y_pos++) {
      const int pos = y_pos * pic_width + x_pos;
      // valid data
      if (src_is_added[pos]) {
        block_hash curr_block_hash;
        curr_block_hash.x = x_pos;
        curr_block_hash.y = y_pos;

        const uint32_t hash_value1 = (src_hash[0][pos] & crc_mask) + add_value;
        curr_block_hash.hash_value2 = src_hash[1][pos];

        if (!hash_table_add_to_table(p_hash_table, hash_value1,
                                     &curr_block_hash)) {
          return false;
        }
      }
    }
  }
  return true;
}